

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Sampler * vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::createRefSampler
                    (Sampler *__return_storage_ptr__,bool isFirst)

{
  Vector<float,_4> local_2c;
  Vector<float,_4> local_1c;
  undefined1 local_9;
  bool isFirst_local;
  
  local_9 = isFirst;
  if (isFirst) {
    tcu::Vector<float,_4>::Vector(&local_1c,0.0,0.0,0.0,0.0);
    tcu::Sampler::Sampler
              (__return_storage_ptr__,REPEAT_GL,REPEAT_GL,REPEAT_GL,LINEAR,LINEAR,0.0,true,
               COMPAREMODE_NONE,0,&local_1c,false,MODE_DEPTH);
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_2c,0.0,0.0,0.0,0.0);
    tcu::Sampler::Sampler
              (__return_storage_ptr__,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,
               true,COMPAREMODE_NONE,0,&local_2c,false,MODE_DEPTH);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Sampler ImageSampleInstanceImages::createRefSampler (bool isFirst)
{
	if (isFirst)
	{
		// linear, wrapping
		return tcu::Sampler(tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR);
	}
	else
	{
		// nearest, clamping
		return tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST);
	}
}